

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O3

void __thiscall
duckdb::Binder::ExtractUnpivotEntries
          (Binder *this,Binder *child_binder,PivotColumnEntry *entry,
          vector<duckdb::UnpivotEntry,_true> *unpivot_entries)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  size_type sVar3;
  pointer pPVar4;
  ColumnRefExpression *this_00;
  BinderException *this_01;
  pointer *__ptr;
  _Alloc_hider this_02;
  pointer this_03;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  star_columns;
  string column_name;
  UnpivotEntry unpivot_entry;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_d8;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_d0;
  string local_c8;
  vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_> *local_a8;
  string local_a0;
  undefined1 local_80 [32];
  pointer local_60;
  pointer pbStack_58;
  pointer local_50;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  vStack_48;
  
  local_d8._M_head_impl =
       (entry->expr).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  local_a8 = &unpivot_entries->
              super_vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>;
  if (local_d8._M_head_impl == (ParsedExpression *)0x0) {
    local_80._0_8_ = local_80 + 0x10;
    local_80._8_8_ = 0;
    local_80[0x10] = '\0';
    local_60 = (pointer)0x0;
    pbStack_58 = (pointer)0x0;
    local_50 = (pointer)0x0;
    vStack_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_48.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::__cxx11::string::_M_assign((string *)local_80);
    this_03 = (entry->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar2 = (entry->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (this_03 != pVVar2) {
      paVar1 = &local_c8.field_2;
      do {
        Value::ToString_abi_cxx11_(&local_a0,this_03);
        sVar3 = local_a0._M_string_length;
        if (local_a0._M_string_length == 0) {
          this_01 = (BinderException *)__cxa_allocate_exception(0x10);
          local_c8._M_dataplus._M_p = (pointer)paVar1;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"UNPIVOT - empty column name not supported","");
          BinderException::BinderException(this_01,&local_c8);
          __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        this_00 = (ColumnRefExpression *)operator_new(0x50);
        local_c8._M_dataplus._M_p = (pointer)paVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_a0._M_dataplus._M_p,local_a0._M_dataplus._M_p + sVar3);
        ColumnRefExpression::ColumnRefExpression(this_00,&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
        local_d0._M_head_impl = (ParsedExpression *)this_00;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&vStack_48,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_d0);
        if ((ColumnRefExpression *)local_d0._M_head_impl != (ColumnRefExpression *)0x0) {
          (*((BaseExpression *)&((local_d0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression
            )->_vptr_BaseExpression[1])();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
        this_03 = this_03 + 1;
      } while (this_03 != pVVar2);
    }
    ::std::vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>::
    emplace_back<duckdb::UnpivotEntry>(local_a8,(UnpivotEntry *)local_80);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&vStack_48);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_60);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_);
    }
  }
  else {
    local_c8._M_dataplus._M_p = (pointer)0x0;
    local_c8._M_string_length = 0;
    local_c8.field_2._M_allocated_capacity = 0;
    (entry->expr).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0
    ;
    ExpandStarExpression
              (child_binder,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_d8,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_c8);
    if (local_d8._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_d8._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    sVar3 = local_c8._M_string_length;
    local_d8._M_head_impl = (ParsedExpression *)0x0;
    if (local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
      this_02._M_p = local_c8._M_dataplus._M_p;
      do {
        local_80._8_8_ = 0;
        local_80[0x10] = '\0';
        vStack_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_50 = (pointer)0x0;
        vStack_48.
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_60 = (pointer)0x0;
        pbStack_58 = (pointer)0x0;
        local_80._0_8_ = local_80 + 0x10;
        pPVar4 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                 ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                               *)this_02._M_p);
        if ((pPVar4->super_BaseExpression).alias._M_string_length != 0) {
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)this_02._M_p);
          ::std::__cxx11::string::_M_assign((string *)local_80);
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&vStack_48,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)this_02._M_p);
        ::std::vector<duckdb::UnpivotEntry,_std::allocator<duckdb::UnpivotEntry>_>::
        emplace_back<duckdb::UnpivotEntry>(local_a8,(UnpivotEntry *)local_80);
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ::~vector(&vStack_48);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_60);
        if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
          operator_delete((void *)local_80._0_8_);
        }
        this_02._M_p = this_02._M_p + 8;
      } while (this_02._M_p != (pointer)sVar3);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)&local_c8);
  }
  return;
}

Assistant:

void Binder::ExtractUnpivotEntries(Binder &child_binder, PivotColumnEntry &entry,
                                   vector<UnpivotEntry> &unpivot_entries) {
	if (!entry.expr) {
		// pivot entry without an expression - generate one
		UnpivotEntry unpivot_entry;
		unpivot_entry.alias = entry.alias;
		for (auto &val : entry.values) {
			auto column_name = val.ToString();
			if (column_name.empty()) {
				throw BinderException("UNPIVOT - empty column name not supported");
			}
			unpivot_entry.expressions.push_back(make_uniq<ColumnRefExpression>(column_name));
		}
		unpivot_entries.push_back(std::move(unpivot_entry));
		return;
	}
	D_ASSERT(entry.values.empty());
	// expand star expressions (if any)
	vector<unique_ptr<ParsedExpression>> star_columns;
	child_binder.ExpandStarExpression(std::move(entry.expr), star_columns);

	for (auto &expr : star_columns) {
		// create one pivot entry per result column
		UnpivotEntry unpivot_entry;
		if (!expr->GetAlias().empty()) {
			unpivot_entry.alias = expr->GetAlias();
		}
		unpivot_entry.expressions.push_back(std::move(expr));
		unpivot_entries.push_back(std::move(unpivot_entry));
	}
}